

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLDSA.cpp
# Opt level: O1

bool __thiscall OSSLDSA::signUpdate(OSSLDSA *this,ByteString *dataToSign)

{
  bool bVar1;
  int iVar2;
  ByteString dummy;
  ByteString local_38;
  
  bVar1 = AsymmetricAlgorithm::signUpdate(&this->super_AsymmetricAlgorithm,dataToSign);
  if (bVar1) {
    iVar2 = (*this->pCurrentHash->_vptr_HashAlgorithm[3])(this->pCurrentHash,dataToSign);
    if ((char)iVar2 != '\0') {
      return true;
    }
    if (this->pCurrentHash != (HashAlgorithm *)0x0) {
      (*this->pCurrentHash->_vptr_HashAlgorithm[1])();
    }
    this->pCurrentHash = (HashAlgorithm *)0x0;
    ByteString::ByteString(&local_38);
    AsymmetricAlgorithm::signFinal(&this->super_AsymmetricAlgorithm,&local_38);
    local_38._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_38.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  }
  return false;
}

Assistant:

bool OSSLDSA::signUpdate(const ByteString& dataToSign)
{
	if (!AsymmetricAlgorithm::signUpdate(dataToSign))
	{
		return false;
	}

	if (!pCurrentHash->hashUpdate(dataToSign))
	{
		delete pCurrentHash;
		pCurrentHash = NULL;

		ByteString dummy;
		AsymmetricAlgorithm::signFinal(dummy);

		return false;
	}

	return true;
}